

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipaddress.cxx
# Opt level: O0

int main(void)

{
  __sighandler_t p_Var1;
  char *pcVar2;
  undefined8 uVar3;
  exception *e;
  seconds oneSecond;
  OledI2C oled;
  string what;
  value_type signal;
  const_iterator __end1;
  const_iterator __begin1;
  array<int,_2UL> *__range1;
  array<int,_2UL> signals;
  OledI2C *this;
  allocator<char> local_501;
  string local_500 [64];
  OledI2C *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  error_category *in_stack_fffffffffffffb50;
  int in_stack_fffffffffffffb5c;
  system_error *in_stack_fffffffffffffb60;
  OledI2C *in_stack_fffffffffffffb90;
  uint8_t in_stack_fffffffffffffcb7;
  string *in_stack_fffffffffffffcb8;
  OledI2C *in_stack_fffffffffffffcc0;
  allocator local_51;
  string local_50 [36];
  int local_2c;
  int *local_28;
  int *local_20;
  undefined8 *local_18;
  undefined8 local_c;
  undefined4 local_4;
  
  local_4 = 0;
  local_c = 0xf00000002;
  local_18 = &local_c;
  local_20 = std::array<int,_2UL>::begin((array<int,_2UL> *)0x1077ce);
  local_28 = std::array<int,_2UL>::end((array<int,_2UL> *)0x1077e3);
  while( true ) {
    if (local_20 == local_28) {
      this = (OledI2C *)&local_501;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_500,"/dev/i2c-1",(allocator *)this);
      SSD1306::OledI2C::OledI2C
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb7);
      std::__cxx11::string::~string(local_500);
      std::allocator<char>::~allocator(&local_501);
      while ((anonymous_namespace)::run != 0) {
        showAddresses(in_stack_fffffffffffffb40);
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)0x1);
      }
      SSD1306::OledI2C::clear((OledI2C *)0x107adb);
      SSD1306::OledI2C::displayUpdate(in_stack_fffffffffffffb90);
      SSD1306::OledI2C::~OledI2C(this);
      return 0;
    }
    local_2c = *local_20;
    p_Var1 = ::signal(local_2c,signalHandler);
    if (p_Var1 == (__sighandler_t)0xffffffffffffffff) break;
    local_20 = local_20 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"installing ",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar2 = strsignal(local_2c);
  std::__cxx11::string::operator+=(local_50,pcVar2);
  std::__cxx11::string::operator+=(local_50," signal handler");
  uVar3 = __cxa_allocate_exception(0x20);
  __errno_location();
  std::_V2::system_category();
  std::system_error::system_error
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

int
main()
{
    try
    {
        constexpr std::array<int, 2> signals{SIGINT, SIGTERM};

        for (auto signal : signals)
        {
            if (std::signal(signal, signalHandler) == SIG_ERR)
            {
                std::string what{"installing "};
                what += strsignal(signal);
                what += " signal handler";

                throw std::system_error(errno,
                                        std::system_category(),
                                        what);
            }
        }

        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        while (run)
        {
            showAddresses(oled);
            constexpr auto oneSecond(std::chrono::seconds(1));
            std::this_thread::sleep_for(oneSecond);
        }

        oled.clear();
        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}